

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfusefilter.h
# Opt level: O0

void binary_fuse16_free(binary_fuse16_t *filter)

{
  undefined8 *in_RDI;
  
  free((void *)in_RDI[4]);
  in_RDI[4] = 0;
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 1) = 0;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  *(undefined4 *)(in_RDI + 2) = 0;
  *(undefined4 *)((long)in_RDI + 0x14) = 0;
  *(undefined4 *)(in_RDI + 3) = 0;
  *(undefined4 *)((long)in_RDI + 0x1c) = 0;
  return;
}

Assistant:

static inline void binary_fuse16_free(binary_fuse16_t *filter) {
  free(filter->Fingerprints);
  filter->Fingerprints = NULL;
  filter->Seed = 0;
  filter->Size = 0;
  filter->SegmentLength = 0;
  filter->SegmentLengthMask = 0;
  filter->SegmentCount = 0;
  filter->SegmentCountLength = 0;
  filter->ArrayLength = 0;
}